

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::android::testNoUnknownExtensions
          (TestStatus *__return_storage_ptr__,Context *context)

{
  TestLog *log;
  TestStatus *pTVar1;
  qpTestResult qVar2;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  _Alloc_hider _Var5;
  vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> layers;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedInstanceExtensions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allowedDeviceExtensions;
  ResultCollector results;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  TestStatus *local_100;
  _Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> local_f8;
  undefined1 local_e0 [32];
  _Base_ptr local_c0;
  size_t local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  undefined1 local_80 [80];
  
  log = context->m_testCtx->m_log;
  local_100 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_e0,"",(allocator<char> *)&local_b0);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_80,log,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  local_e0._24_8_ = local_e0 + 8;
  local_e0._8_4_ = _S_red;
  local_e0._16_8_ = 0;
  local_b8 = 0;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0 = (_Base_ptr)local_e0._24_8_;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"VK_GOOGLE_display_timing",(allocator<char> *)&local_f8);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_b0,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  ::vk::enumerateInstanceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &local_120,context->m_platformInterface,(char *)0x0);
  checkExtensions((ResultCollector *)local_80,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e0,
                  (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
                  &local_120);
  std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
  ~_Vector_base((_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                 *)&local_120);
  ::vk::enumerateInstanceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&local_120,
             context->m_platformInterface);
  for (_Var5._M_p = local_120._M_dataplus._M_p; _Var5._M_p != (pointer)local_120._M_string_length;
      _Var5._M_p = _Var5._M_p + 0x208) {
    ::vk::enumerateInstanceExtensionProperties
              ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
               &local_f8,context->m_platformInterface,_Var5._M_p);
    checkExtensions((ResultCollector *)local_80,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_e0,
                    (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *
                    )&local_f8);
    std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
    ~_Vector_base(&local_f8);
  }
  std::_Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~_Vector_base
            ((_Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
             &local_120);
  pIVar3 = Context::getInstanceInterface(context);
  pVVar4 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &local_120,pIVar3,pVVar4,(char *)0x0);
  checkExtensions((ResultCollector *)local_80,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b0,
                  (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
                  &local_120);
  std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
  ~_Vector_base((_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                 *)&local_120);
  pIVar3 = Context::getInstanceInterface(context);
  pVVar4 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&local_120,
             pIVar3,pVVar4);
  for (_Var5._M_p = local_120._M_dataplus._M_p; _Var5._M_p != (pointer)local_120._M_string_length;
      _Var5._M_p = _Var5._M_p + 0x208) {
    pIVar3 = Context::getInstanceInterface(context);
    pVVar4 = Context::getPhysicalDevice(context);
    ::vk::enumerateDeviceExtensionProperties
              ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
               &local_f8,pIVar3,pVVar4,_Var5._M_p);
    checkExtensions((ResultCollector *)local_80,
                    (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_b0,
                    (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *
                    )&local_f8);
    std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
    ~_Vector_base(&local_f8);
  }
  std::_Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~_Vector_base
            ((_Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)
             &local_120);
  qVar2 = tcu::ResultCollector::getResult((ResultCollector *)local_80);
  std::__cxx11::string::string((string *)&local_120,(string *)(local_80 + 0x30));
  pTVar1 = local_100;
  local_100->m_code = qVar2;
  std::__cxx11::string::string((string *)&local_100->m_description,(string *)&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_e0);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_80);
  return pTVar1;
}

Assistant:

tcu::TestStatus testNoUnknownExtensions (Context& context)
{
	TestLog&				log					= context.getTestContext().getLog();
	tcu::ResultCollector	results				(log);
	set<string>				allowedInstanceExtensions;
	set<string>				allowedDeviceExtensions;

	// All known extensions should be added to allowedExtensions:
	// allowedExtensions.insert("VK_GOOGLE_extension1");
	allowedDeviceExtensions.insert("VK_GOOGLE_display_timing");

	// Instance extensions
	checkExtensions(results,
					allowedInstanceExtensions,
					enumerateInstanceExtensionProperties(context.getPlatformInterface(), DE_NULL));

	// Extensions exposed by instance layers
	{
		const vector<VkLayerProperties>	layers	= enumerateInstanceLayerProperties(context.getPlatformInterface());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
		{
			checkExtensions(results,
							allowedInstanceExtensions,
							enumerateInstanceExtensionProperties(context.getPlatformInterface(), layer->layerName));
		}
	}

	// Device extensions
	checkExtensions(results,
					allowedDeviceExtensions,
					enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), DE_NULL));

	// Extensions exposed by device layers
	{
		const vector<VkLayerProperties>	layers	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
		{
			checkExtensions(results,
							allowedDeviceExtensions,
							enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), layer->layerName));
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}